

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walTryBeginRead(Wal *pWal,int *pChanged,int useWal,int cnt)

{
  uint uVar1;
  uint uVar2;
  u32 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  u32 uVar8;
  u32 uVar9;
  u32 uVar10;
  int iVar11;
  ulong uVar12;
  sqlite3_io_methods *psVar13;
  u8 *aFrame;
  int iVar14;
  long lVar15;
  int iVar16;
  sqlite3_file *psVar17;
  uint uVar18;
  u64 n;
  ulong uVar19;
  bool bVar20;
  i64 szWal;
  u32 pgno;
  void *pDummy;
  u8 aBuf [32];
  long local_88;
  u32 local_7c;
  u32 local_78;
  u32 local_74;
  u8 *local_70;
  u32 local_64;
  void *local_60;
  undefined1 local_58 [16];
  long local_48;
  
  if (5 < cnt) {
    if (100 < cnt) {
      return 0xf;
    }
    iVar11 = 1;
    if (9 < cnt) {
      iVar11 = (cnt + -9) * (cnt + -9) * 0x27;
    }
    (*pWal->pVfs->xSleep)(pWal->pVfs,iVar11);
  }
  if (useWal == 0) {
    iVar11 = 0;
    if (pWal->bShmUnreliable == '\0') {
      iVar11 = walIndexReadHdr(pWal,pChanged);
    }
    if ((iVar11 == 5) && (iVar11 = -1, *pWal->apWiData != (u32 *)0x0)) {
      iVar14 = 0;
      if (pWal->exclusiveMode == '\0') {
        iVar14 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,2,1,6);
      }
      if (iVar14 == 0) {
        iVar11 = -1;
        if (pWal->exclusiveMode == '\0') {
          (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,2,1,5);
          iVar11 = -1;
        }
      }
      else {
        iVar11 = 0x105;
        if (iVar14 != 5) {
          iVar11 = iVar14;
        }
      }
    }
    if (iVar11 != 0) {
      return iVar11;
    }
    if (pWal->bShmUnreliable != '\0') {
      iVar11 = 0;
      if (pWal->exclusiveMode == '\0') {
        iVar11 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,6);
      }
      if (iVar11 == 0) {
        pWal->readLock = 0;
        iVar11 = (*pWal->pDbFd->pMethods->xShmMap)(pWal->pDbFd,0,0x8000,0,&local_60);
        if (iVar11 != 0x508) {
          bVar20 = iVar11 == 8;
          goto LAB_0014b064;
        }
        psVar17 = pWal->pWalFd;
        puVar3 = *pWal->apWiData;
        uVar8 = puVar3[1];
        uVar4 = *(undefined8 *)(puVar3 + 2);
        uVar9 = puVar3[4];
        uVar10 = puVar3[5];
        uVar5 = *(undefined8 *)(puVar3 + 6);
        uVar6 = *(undefined8 *)(puVar3 + 8);
        uVar7 = *(undefined8 *)(puVar3 + 10);
        (pWal->hdr).iVersion = puVar3[0];
        (pWal->hdr).unused = uVar8;
        (pWal->hdr).iChange = (int)uVar4;
        (pWal->hdr).isInit = (char)((ulong)uVar4 >> 0x20);
        (pWal->hdr).bigEndCksum = (char)((ulong)uVar4 >> 0x28);
        (pWal->hdr).szPage = (short)((ulong)uVar4 >> 0x30);
        (pWal->hdr).mxFrame = uVar9;
        (pWal->hdr).nPage = uVar10;
        *(undefined8 *)(pWal->hdr).aFrameCksum = uVar5;
        *(undefined8 *)(pWal->hdr).aSalt = uVar6;
        *(undefined8 *)(pWal->hdr).aCksum = uVar7;
        iVar14 = (*psVar17->pMethods->xFileSize)(psVar17,&local_88);
        if (iVar14 == 0) {
          if (local_88 < 0x20) {
            *pChanged = 1;
            aFrame = (u8 *)0x0;
            iVar14 = -(uint)((pWal->hdr).mxFrame != 0);
            goto LAB_0014b06f;
          }
          aFrame = (u8 *)0x0;
          iVar14 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,local_58,0x20,0);
          if (iVar14 != 0) goto LAB_0014b06f;
          if (*(long *)(pWal->hdr).aSalt != local_48) {
            aFrame = (u8 *)0x0;
            iVar14 = -1;
            goto LAB_0014b06f;
          }
          iVar11 = pWal->szPage + 0x18;
          n = (u64)iVar11;
          iVar14 = sqlite3_initialize();
          if (iVar14 == 0) {
            aFrame = (u8 *)sqlite3Malloc(n);
          }
          else {
            aFrame = (u8 *)0x0;
          }
          iVar14 = 0;
          if (aFrame != (u8 *)0x0) {
            local_78 = (pWal->hdr).aFrameCksum[0];
            local_7c = (pWal->hdr).aFrameCksum[1];
            lVar15 = (ulong)(pWal->szPage + 0x18) * (ulong)(pWal->hdr).mxFrame;
            if ((long)(n + 0x20 + lVar15) <= local_88) {
              local_70 = aFrame + 0x18;
              lVar15 = lVar15 + 0x20;
              do {
                iVar14 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,aFrame,iVar11,lVar15);
                if (iVar14 == 0) {
                  iVar14 = walDecodeFrame(pWal,&local_64,&local_74,local_70,aFrame);
                  if (iVar14 == 0) {
                    bVar20 = false;
                    iVar14 = 0;
                  }
                  else {
                    bVar20 = local_74 == 0;
                    iVar14 = -(uint)!bVar20;
                  }
                }
                else {
                  bVar20 = false;
                }
              } while ((bVar20) && (lVar15 = lVar15 + n, (long)(n + lVar15) <= local_88));
            }
            (pWal->hdr).aFrameCksum[0] = local_78;
            (pWal->hdr).aFrameCksum[1] = local_7c;
            goto LAB_0014b06f;
          }
          iVar14 = 7;
        }
      }
      else {
        bVar20 = iVar11 == 5;
LAB_0014b064:
        iVar14 = -1;
        if (!bVar20) {
          iVar14 = iVar11;
        }
      }
      aFrame = (u8 *)0x0;
LAB_0014b06f:
      sqlite3_free(aFrame);
      if (iVar14 != 0) {
        if (0 < pWal->nWiData) {
          lVar15 = 0;
          do {
            sqlite3_free(pWal->apWiData[lVar15]);
            pWal->apWiData[lVar15] = (u32 *)0x0;
            lVar15 = lVar15 + 1;
          } while (lVar15 < pWal->nWiData);
        }
        pWal->bShmUnreliable = '\0';
        sqlite3WalEndReadTransaction(pWal);
        *pChanged = 1;
        return iVar14;
      }
      return 0;
    }
  }
  uVar18 = 0;
  puVar3 = *pWal->apWiData;
  iVar11 = 0;
  if ((useWal == 0) && (iVar11 = 0, puVar3[0x18] == (pWal->hdr).mxFrame)) {
    iVar11 = 0;
    if (pWal->exclusiveMode == '\0') {
      iVar11 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,6);
    }
    if (pWal->exclusiveMode != '\x02') {
      (*pWal->pDbFd->pMethods->xShmBarrier)(pWal->pDbFd);
    }
    if (iVar11 != 5) {
      if (iVar11 != 0) {
        return iVar11;
      }
      iVar11 = bcmp(*pWal->apWiData,&pWal->hdr,0x30);
      if (iVar11 == 0) {
        pWal->readLock = 0;
        return 0;
      }
      if (pWal->exclusiveMode != '\0') {
        return -1;
      }
      psVar17 = pWal->pDbFd;
      psVar13 = psVar17->pMethods;
      iVar11 = 3;
      goto LAB_0014af36;
    }
  }
  uVar1 = (pWal->hdr).mxFrame;
  uVar12 = 0;
  uVar19 = 0;
  do {
    uVar2 = puVar3[uVar12 + 0x1a];
    uVar12 = uVar12 + 1;
    if (uVar2 <= uVar1 && uVar18 <= uVar2) {
      uVar19 = uVar12 & 0xffffffff;
      uVar18 = uVar2;
    }
    iVar14 = (int)uVar19;
  } while (uVar12 != 4);
  if (((pWal->readOnly & 2) == 0) && ((uVar18 < uVar1 || (iVar14 == 0)))) {
    lVar15 = 0;
    do {
      iVar16 = (int)lVar15 + 4;
      iVar11 = 0;
      if (pWal->exclusiveMode == '\0') {
        iVar11 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar16,1,10);
      }
      if (iVar11 != 5) {
        if (iVar11 != 0) {
          return iVar11;
        }
        puVar3[lVar15 + 0x1a] = uVar1;
        iVar14 = (int)lVar15 + 1;
        if (pWal->exclusiveMode == '\0') {
          (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar16,1,9);
        }
        iVar11 = 0;
        uVar18 = uVar1;
        goto LAB_0014adf0;
      }
      lVar15 = lVar15 + 1;
    } while ((int)lVar15 != 4);
    iVar11 = 5;
  }
LAB_0014adf0:
  if (iVar14 == 0) {
    return -(uint)(iVar11 == 5) | 0x508;
  }
  iVar11 = iVar14 + 3;
  iVar16 = 0;
  if (pWal->exclusiveMode == '\0') {
    iVar16 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar11,1,6);
  }
  if (iVar16 != 0) {
    if (iVar16 != 5) {
      return iVar16;
    }
    return -1;
  }
  pWal->minFrame = puVar3[0x18] + 1;
  if (pWal->exclusiveMode != '\x02') {
    (*pWal->pDbFd->pMethods->xShmBarrier)(pWal->pDbFd);
  }
  if ((puVar3[(long)iVar14 + 0x19] == uVar18) &&
     (iVar16 = bcmp(*pWal->apWiData,&pWal->hdr,0x30), iVar16 == 0)) {
    pWal->readLock = (i16)iVar14;
    return 0;
  }
  if (pWal->exclusiveMode != '\0') {
    return -1;
  }
  psVar17 = pWal->pDbFd;
  psVar13 = psVar17->pMethods;
LAB_0014af36:
  (*psVar13->xShmLock)(psVar17,iVar11,1,5);
  return -1;
}

Assistant:

static int walTryBeginRead(Wal *pWal, int *pChanged, int useWal, int cnt){
  volatile WalCkptInfo *pInfo;    /* Checkpoint information in wal-index */
  u32 mxReadMark;                 /* Largest aReadMark[] value */
  int mxI;                        /* Index of largest aReadMark[] value */
  int i;                          /* Loop counter */
  int rc = SQLITE_OK;             /* Return code  */
  u32 mxFrame;                    /* Wal frame to lock to */

  assert( pWal->readLock<0 );     /* Not currently locked */

  /* useWal may only be set for read/write connections */
  assert( (pWal->readOnly & WAL_SHM_RDONLY)==0 || useWal==0 );

  /* Take steps to avoid spinning forever if there is a protocol error.
  **
  ** Circumstances that cause a RETRY should only last for the briefest
  ** instances of time.  No I/O or other system calls are done while the
  ** locks are held, so the locks should not be held for very long. But
  ** if we are unlucky, another process that is holding a lock might get
  ** paged out or take a page-fault that is time-consuming to resolve,
  ** during the few nanoseconds that it is holding the lock.  In that case,
  ** it might take longer than normal for the lock to free.
  **
  ** After 5 RETRYs, we begin calling sqlite3OsSleep().  The first few
  ** calls to sqlite3OsSleep() have a delay of 1 microsecond.  Really this
  ** is more of a scheduler yield than an actual delay.  But on the 10th
  ** an subsequent retries, the delays start becoming longer and longer,
  ** so that on the 100th (and last) RETRY we delay for 323 milliseconds.
  ** The total delay time before giving up is less than 10 seconds.
  */
  if( cnt>5 ){
    int nDelay = 1;                      /* Pause time in microseconds */
    if( cnt>100 ){
      VVA_ONLY( pWal->lockError = 1; )
      return SQLITE_PROTOCOL;
    }
    if( cnt>=10 ) nDelay = (cnt-9)*(cnt-9)*39;
    sqlite3OsSleep(pWal->pVfs, nDelay);
  }

  if( !useWal ){
    assert( rc==SQLITE_OK );
    if( pWal->bShmUnreliable==0 ){
      rc = walIndexReadHdr(pWal, pChanged);
    }
    if( rc==SQLITE_BUSY ){
      /* If there is not a recovery running in another thread or process
      ** then convert BUSY errors to WAL_RETRY.  If recovery is known to
      ** be running, convert BUSY to BUSY_RECOVERY.  There is a race here
      ** which might cause WAL_RETRY to be returned even if BUSY_RECOVERY
      ** would be technically correct.  But the race is benign since with
      ** WAL_RETRY this routine will be called again and will probably be
      ** right on the second iteration.
      */
      if( pWal->apWiData[0]==0 ){
        /* This branch is taken when the xShmMap() method returns SQLITE_BUSY.
        ** We assume this is a transient condition, so return WAL_RETRY. The
        ** xShmMap() implementation used by the default unix and win32 VFS
        ** modules may return SQLITE_BUSY due to a race condition in the
        ** code that determines whether or not the shared-memory region
        ** must be zeroed before the requested page is returned.
        */
        rc = WAL_RETRY;
      }else if( SQLITE_OK==(rc = walLockShared(pWal, WAL_RECOVER_LOCK)) ){
        walUnlockShared(pWal, WAL_RECOVER_LOCK);
        rc = WAL_RETRY;
      }else if( rc==SQLITE_BUSY ){
        rc = SQLITE_BUSY_RECOVERY;
      }
    }
    if( rc!=SQLITE_OK ){
      return rc;
    }
    else if( pWal->bShmUnreliable ){
      return walBeginShmUnreliable(pWal, pChanged);
    }
  }

  assert( pWal->nWiData>0 );
  assert( pWal->apWiData[0]!=0 );
  pInfo = walCkptInfo(pWal);
  if( !useWal && AtomicLoad(&pInfo->nBackfill)==pWal->hdr.mxFrame
#ifdef SQLITE_ENABLE_SNAPSHOT
   && (pWal->pSnapshot==0 || pWal->hdr.mxFrame==0)
#endif
  ){
    /* The WAL has been completely backfilled (or it is empty).
    ** and can be safely ignored.
    */
    rc = walLockShared(pWal, WAL_READ_LOCK(0));
    walShmBarrier(pWal);
    if( rc==SQLITE_OK ){
      if( memcmp((void *)walIndexHdr(pWal), &pWal->hdr, sizeof(WalIndexHdr)) ){
        /* It is not safe to allow the reader to continue here if frames
        ** may have been appended to the log before READ_LOCK(0) was obtained.
        ** When holding READ_LOCK(0), the reader ignores the entire log file,
        ** which implies that the database file contains a trustworthy
        ** snapshot. Since holding READ_LOCK(0) prevents a checkpoint from
        ** happening, this is usually correct.
        **
        ** However, if frames have been appended to the log (or if the log
        ** is wrapped and written for that matter) before the READ_LOCK(0)
        ** is obtained, that is not necessarily true. A checkpointer may
        ** have started to backfill the appended frames but crashed before
        ** it finished. Leaving a corrupt image in the database file.
        */
        walUnlockShared(pWal, WAL_READ_LOCK(0));
        return WAL_RETRY;
      }
      pWal->readLock = 0;
      return SQLITE_OK;
    }else if( rc!=SQLITE_BUSY ){
      return rc;
    }
  }

  /* If we get this far, it means that the reader will want to use
  ** the WAL to get at content from recent commits.  The job now is
  ** to select one of the aReadMark[] entries that is closest to
  ** but not exceeding pWal->hdr.mxFrame and lock that entry.
  */
  mxReadMark = 0;
  mxI = 0;
  mxFrame = pWal->hdr.mxFrame;
#ifdef SQLITE_ENABLE_SNAPSHOT
  if( pWal->pSnapshot && pWal->pSnapshot->mxFrame<mxFrame ){
    mxFrame = pWal->pSnapshot->mxFrame;
  }
#endif
  for(i=1; i<WAL_NREADER; i++){
    u32 thisMark = AtomicLoad(pInfo->aReadMark+i);
    if( mxReadMark<=thisMark && thisMark<=mxFrame ){
      assert( thisMark!=READMARK_NOT_USED );
      mxReadMark = thisMark;
      mxI = i;
    }
  }
  if( (pWal->readOnly & WAL_SHM_RDONLY)==0
   && (mxReadMark<mxFrame || mxI==0)
  ){
    for(i=1; i<WAL_NREADER; i++){
      rc = walLockExclusive(pWal, WAL_READ_LOCK(i), 1);
      if( rc==SQLITE_OK ){
        AtomicStore(pInfo->aReadMark+i,mxFrame);
        mxReadMark = mxFrame;
        mxI = i;
        walUnlockExclusive(pWal, WAL_READ_LOCK(i), 1);
        break;
      }else if( rc!=SQLITE_BUSY ){
        return rc;
      }
    }
  }
  if( mxI==0 ){
    assert( rc==SQLITE_BUSY || (pWal->readOnly & WAL_SHM_RDONLY)!=0 );
    return rc==SQLITE_BUSY ? WAL_RETRY : SQLITE_READONLY_CANTINIT;
  }

  rc = walLockShared(pWal, WAL_READ_LOCK(mxI));
  if( rc ){
    return rc==SQLITE_BUSY ? WAL_RETRY : rc;
  }
  /* Now that the read-lock has been obtained, check that neither the
  ** value in the aReadMark[] array or the contents of the wal-index
  ** header have changed.
  **
  ** It is necessary to check that the wal-index header did not change
  ** between the time it was read and when the shared-lock was obtained
  ** on WAL_READ_LOCK(mxI) was obtained to account for the possibility
  ** that the log file may have been wrapped by a writer, or that frames
  ** that occur later in the log than pWal->hdr.mxFrame may have been
  ** copied into the database by a checkpointer. If either of these things
  ** happened, then reading the database with the current value of
  ** pWal->hdr.mxFrame risks reading a corrupted snapshot. So, retry
  ** instead.
  **
  ** Before checking that the live wal-index header has not changed
  ** since it was read, set Wal.minFrame to the first frame in the wal
  ** file that has not yet been checkpointed. This client will not need
  ** to read any frames earlier than minFrame from the wal file - they
  ** can be safely read directly from the database file.
  **
  ** Because a ShmBarrier() call is made between taking the copy of
  ** nBackfill and checking that the wal-header in shared-memory still
  ** matches the one cached in pWal->hdr, it is guaranteed that the
  ** checkpointer that set nBackfill was not working with a wal-index
  ** header newer than that cached in pWal->hdr. If it were, that could
  ** cause a problem. The checkpointer could omit to checkpoint
  ** a version of page X that lies before pWal->minFrame (call that version
  ** A) on the basis that there is a newer version (version B) of the same
  ** page later in the wal file. But if version B happens to like past
  ** frame pWal->hdr.mxFrame - then the client would incorrectly assume
  ** that it can read version A from the database file. However, since
  ** we can guarantee that the checkpointer that set nBackfill could not
  ** see any pages past pWal->hdr.mxFrame, this problem does not come up.
  */
  pWal->minFrame = AtomicLoad(&pInfo->nBackfill)+1;
  walShmBarrier(pWal);
  if( AtomicLoad(pInfo->aReadMark+mxI)!=mxReadMark
   || memcmp((void *)walIndexHdr(pWal), &pWal->hdr, sizeof(WalIndexHdr))
  ){
    walUnlockShared(pWal, WAL_READ_LOCK(mxI));
    return WAL_RETRY;
  }else{
    assert( mxReadMark<=pWal->hdr.mxFrame );
    pWal->readLock = (i16)mxI;
  }
  return rc;
}